

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdnslookup_p.cpp
# Opt level: O2

void QDnsLookupRunnable::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_id == 0 && _c == InvokeMetaMethod) {
    finished((QDnsLookupRunnable *)_o,(QDnsLookupReply *)_a[1]);
  }
  if (_c == IndexOfMethod) {
    QtMocHelpers::indexOfMethod<void(QDnsLookupRunnable::*)(QDnsLookupReply_const&)>
              ((QtMocHelpers *)_a,(void **)finished,0,0);
    return;
  }
  return;
}

Assistant:

void QDnsLookupRunnable::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDnsLookupRunnable *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<QDnsLookupReply>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDnsLookupRunnable::*)(const QDnsLookupReply & )>(_a, &QDnsLookupRunnable::finished, 0))
            return;
    }
}